

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void * phmap::priv::
       Allocate<8ul,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                 (Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *alloc,size_t n)

{
  pointer_conflict pMVar1;
  void *p;
  A mem_alloc;
  size_t n_local;
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *alloc_local;
  
  mem_alloc.id_ = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = phmap::priv::Alloc<std::pair<const int, phmap::priv::NonStandardLayout>>]"
                 );
  }
  Alloc<phmap::priv::Allocate<8ul,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>(phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>*,unsigned_long)::M>
  ::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((Alloc<phmap::priv::Allocate<8ul,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>(phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>*,unsigned_long)::M>
              *)&p,alloc);
  pMVar1 = allocator_traits<phmap::priv::Alloc<M>_>::allocate((Alloc<M> *)&p,mem_alloc.id_ + 7 >> 3)
  ;
  if (((ulong)pMVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x1064,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = phmap::priv::Alloc<std::pair<const int, phmap::priv::NonStandardLayout>>]"
                 );
  }
  Alloc<M>::~Alloc((Alloc<M> *)&p);
  return pMVar1;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = &*AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M)); // `&*` to support custom pointers such as boost offset_ptr.
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}